

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O1

MessageFederate * __thiscall
helics::MessageFederate::operator=(MessageFederate *this,MessageFederate *mFed)

{
  pointer __p;
  
  __p = (mFed->mfManager)._M_t.
        super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
        ._M_t.
        super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
        .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl;
  (mFed->mfManager)._M_t.
  super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
  .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl =
       (MessageFederateManager *)0x0;
  std::
  __uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
  ::reset((__uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
           *)&this->mfManager,__p);
  if (*(int *)(&this->field_0x10 + (long)this->_vptr_MessageFederate[-3]) !=
      *(int *)(&mFed->field_0x10 + (long)mFed->_vptr_MessageFederate[-3])) {
    Federate::operator=((Federate *)
                        ((long)&this->_vptr_MessageFederate + (long)this->_vptr_MessageFederate[-3])
                        ,(Federate *)
                         ((long)&mFed->_vptr_MessageFederate + (long)mFed->_vptr_MessageFederate[-3]
                         ));
  }
  return this;
}

Assistant:

MessageFederate& MessageFederate::operator=(MessageFederate&& mFed) noexcept
{
    mfManager = std::move(mFed.mfManager);
    if (getID() != mFed.getID()) {  // the id won't be moved, as it is copied so use it as a test if
                                    // it has moved already
        Federate::operator=(std::move(mFed));
    }
    return *this;
}